

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

PiecewiseLinearActivation * __thiscall
notch::core::PiecewiseLinearActivation::tag_abi_cxx11_(PiecewiseLinearActivation *this)

{
  long in_RSI;
  PiecewiseLinearActivation *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x10));
  return this;
}

Assistant:

virtual std::string tag() const { return name; }